

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_resampler.cc
# Opt level: O1

void webrtc::WebRtcAec_ResampleLinear
               (void *resampInst,float *inspeech,size_t size,float skew,float *outspeech,
               size_t *size_out)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  
  if (0xa0 < size) {
    __assert_fail("size <= 2 * FRAME_LEN",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/aec/aec_resampler.cc"
                  ,0x4d,
                  "void webrtc::WebRtcAec_ResampleLinear(void *, const float *, size_t, float, float *, size_t *)"
                 );
  }
  if (resampInst == (void *)0x0) {
    __assert_fail("resampInst != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/aec/aec_resampler.cc"
                  ,0x4e,
                  "void webrtc::WebRtcAec_ResampleLinear(void *, const float *, size_t, float, float *, size_t *)"
                 );
  }
  if (inspeech == (float *)0x0) {
    __assert_fail("inspeech != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/aec/aec_resampler.cc"
                  ,0x4f,
                  "void webrtc::WebRtcAec_ResampleLinear(void *, const float *, size_t, float, float *, size_t *)"
                 );
  }
  if (outspeech != (float *)0x0) {
    if (size_out != (size_t *)0x0) {
      memcpy((void *)((long)resampInst + 0x144),inspeech,size * 4);
      fVar5 = skew + 1.0;
      fVar4 = fVar5 * 0.0 + *(float *)((long)resampInst + 0x500);
      uVar2 = 0;
      uVar3 = (long)(fVar4 - 9.223372e+18) & (long)fVar4 >> 0x3f | (long)fVar4;
      while (uVar3 < size) {
        fVar1 = *(float *)((long)resampInst + uVar3 * 4 + 0x140);
        outspeech[uVar2] =
             (*(float *)((long)resampInst + uVar3 * 4 + 0x144) - fVar1) *
             (fVar4 - (float)(long)uVar3) + fVar1;
        uVar2 = uVar2 + 1;
        fVar4 = (float)uVar2 * fVar5 + *(float *)((long)resampInst + 0x500);
        uVar3 = (ulong)(int)fVar4;
      }
      *size_out = uVar2;
      *(float *)((long)resampInst + 0x500) =
           ((float)uVar2 * fVar5 - (float)(long)size) + *(float *)((long)resampInst + 0x500);
      memmove(resampInst,(void *)((long)resampInst + size * 4),size * -4 + 0x500);
      return;
    }
    __assert_fail("size_out != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/aec/aec_resampler.cc"
                  ,0x51,
                  "void webrtc::WebRtcAec_ResampleLinear(void *, const float *, size_t, float, float *, size_t *)"
                 );
  }
  __assert_fail("outspeech != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/aec/aec_resampler.cc"
                ,0x50,
                "void webrtc::WebRtcAec_ResampleLinear(void *, const float *, size_t, float, float *, size_t *)"
               );
}

Assistant:

void WebRtcAec_ResampleLinear(void* resampInst,
                              const float* inspeech,
                              size_t size,
                              float skew,
                              float* outspeech,
                              size_t* size_out) {
  AecResampler* obj = static_cast<AecResampler*>(resampInst);

  float* y;
  float be, tnew;
  size_t tn, mm;

  assert(size <= 2 * FRAME_LEN);
  assert(resampInst != NULL);
  assert(inspeech != NULL);
  assert(outspeech != NULL);
  assert(size_out != NULL);

  // Add new frame data in lookahead
  memcpy(&obj->buffer[FRAME_LEN + kResamplingDelay], inspeech,
         size * sizeof(inspeech[0]));

  // Sample rate ratio
  be = 1 + skew;

  // Loop over input frame
  mm = 0;
  y = &obj->buffer[FRAME_LEN];  // Point at current frame

  tnew = be * mm + obj->position;
  tn = (size_t)tnew;

  while (tn < size) {
    // Interpolation
    outspeech[mm] = y[tn] + (tnew - tn) * (y[tn + 1] - y[tn]);
    mm++;

    tnew = be * mm + obj->position;
    tn = static_cast<int>(tnew);
  }

  *size_out = mm;
  obj->position += (*size_out) * be - size;

  // Shift buffer
  memmove(obj->buffer, &obj->buffer[size],
          (kResamplerBufferSize - size) * sizeof(obj->buffer[0]));
}